

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

bool llvm::consumeUnsignedInteger(StringRef *Str,uint Radix,unsigned_long_long *Result)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  size_t sVar4;
  size_t sVar5;
  StringRef SVar6;
  char *local_58;
  char *local_50;
  unsigned_long_long PrevResult;
  undefined1 auStack_38 [4];
  uint CharVal;
  StringRef Str2;
  unsigned_long_long *Result_local;
  uint Radix_local;
  StringRef *Str_local;
  
  Str2.Length = (size_t)Result;
  Result_local._4_4_ = Radix;
  if (Radix == 0) {
    Result_local._4_4_ = GetAutoSenseRadix(Str);
  }
  bVar2 = StringRef::empty(Str);
  if (bVar2) {
    Str_local._7_1_ = true;
  }
  else {
    _auStack_38 = Str->Data;
    Str2.Data = (char *)Str->Length;
    *(undefined8 *)Str2.Length = 0;
    while (bVar2 = StringRef::empty((StringRef *)auStack_38), ((bVar2 ^ 0xffU) & 1) != 0) {
      cVar3 = StringRef::operator[]((StringRef *)auStack_38,0);
      if ((cVar3 < '0') || (cVar3 = StringRef::operator[]((StringRef *)auStack_38,0), '9' < cVar3))
      {
        cVar3 = StringRef::operator[]((StringRef *)auStack_38,0);
        if ((cVar3 < 'a') || (cVar3 = StringRef::operator[]((StringRef *)auStack_38,0), 'z' < cVar3)
           ) {
          cVar3 = StringRef::operator[]((StringRef *)auStack_38,0);
          if ((cVar3 < 'A') ||
             (cVar3 = StringRef::operator[]((StringRef *)auStack_38,0), 'Z' < cVar3)) break;
          cVar3 = StringRef::operator[]((StringRef *)auStack_38,0);
          PrevResult._4_4_ = (int)cVar3 - 0x37;
        }
        else {
          cVar3 = StringRef::operator[]((StringRef *)auStack_38,0);
          PrevResult._4_4_ = (int)cVar3 - 0x57;
        }
      }
      else {
        cVar3 = StringRef::operator[]((StringRef *)auStack_38,0);
        PrevResult._4_4_ = (int)cVar3 - 0x30;
      }
      if (Result_local._4_4_ <= PrevResult._4_4_) break;
      uVar1 = *(ulong *)Str2.Length;
      *(ulong *)Str2.Length =
           *(long *)Str2.Length * (ulong)Result_local._4_4_ + (ulong)PrevResult._4_4_;
      if (*(ulong *)Str2.Length / (ulong)Result_local._4_4_ < uVar1) {
        return true;
      }
      SVar6 = StringRef::substr((StringRef *)auStack_38,1,0xffffffffffffffff);
      local_58 = SVar6.Data;
      _auStack_38 = local_58;
      local_50 = (char *)SVar6.Length;
      Str2.Data = local_50;
    }
    sVar4 = StringRef::size(Str);
    sVar5 = StringRef::size((StringRef *)auStack_38);
    if (sVar4 == sVar5) {
      Str_local._7_1_ = true;
    }
    else {
      Str->Data = _auStack_38;
      Str->Length = (size_t)Str2.Data;
      Str_local._7_1_ = false;
    }
  }
  return Str_local._7_1_;
}

Assistant:

bool llvm::consumeUnsignedInteger(StringRef &Str, unsigned Radix,
                                  unsigned long long &Result) {
  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Parse all the bytes of the string given this radix.  Watch for overflow.
  StringRef Str2 = Str;
  Result = 0;
  while (!Str2.empty()) {
    unsigned CharVal;
    if (Str2[0] >= '0' && Str2[0] <= '9')
      CharVal = Str2[0] - '0';
    else if (Str2[0] >= 'a' && Str2[0] <= 'z')
      CharVal = Str2[0] - 'a' + 10;
    else if (Str2[0] >= 'A' && Str2[0] <= 'Z')
      CharVal = Str2[0] - 'A' + 10;
    else
      break;

    // If the parsed value is larger than the integer radix, we cannot
    // consume any more characters.
    if (CharVal >= Radix)
      break;

    // Add in this character.
    unsigned long long PrevResult = Result;
    Result = Result * Radix + CharVal;

    // Check for overflow by shifting back and seeing if bits were lost.
    if (Result / Radix < PrevResult)
      return true;

    Str2 = Str2.substr(1);
  }

  // We consider the operation a failure if no characters were consumed
  // successfully.
  if (Str.size() == Str2.size())
    return true;

  Str = Str2;
  return false;
}